

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwobjects.h
# Opt level: O0

void __thiscall rw::ObjectWithFrame::setFrame(ObjectWithFrame *this,Frame *f)

{
  Frame *f_local;
  ObjectWithFrame *this_local;
  
  if ((this->object).parent != (void *)0x0) {
    LLLink::remove(&this->inFrame,(char *)f);
  }
  (this->object).parent = f;
  if (f != (Frame *)0x0) {
    LinkList::add(&f->objectList,&this->inFrame);
    Frame::updateObjects(f);
  }
  return;
}

Assistant:

void setFrame(Frame *f){
		if(this->object.parent)
			this->inFrame.remove();
		this->object.parent = f;
		if(f){
			f->objectList.add(&this->inFrame);
			f->updateObjects();
		}
	}